

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O2

cmArgumentParser<cmCoreTryCompile::Arguments> * __thiscall
cmArgumentParser<cmCoreTryCompile::Arguments>::Bind
          (cmArgumentParser<cmCoreTryCompile::Arguments> *this,static_string_view name,
          offset_in_Arguments_to_subr member,ExpectAtLeast expect)

{
  KeywordAction KStack_58;
  anon_class_24_2_a47a4ba1 local_38;
  
  local_38.member = member;
  local_38._8_8_ = expect.Count;
  std::function<void(ArgumentParser::Instance&)>::
  function<cmArgumentParser<cmCoreTryCompile::Arguments>::Bind(cm::static_string_view,ArgumentParser::Continue(cmCoreTryCompile::Arguments::*)(std::basic_string_view<char,std::char_traits<char>>),ArgumentParser::ExpectAtLeast)::_lambda(ArgumentParser::Instance&)_1_,void>
            ((function<void(ArgumentParser::Instance&)> *)&KStack_58,&local_38);
  ArgumentParser::Base::Bind(&this->super_Base,name.super_string_view,&KStack_58);
  std::_Function_base::~_Function_base(&KStack_58.super__Function_base);
  return this;
}

Assistant:

cmArgumentParser& Bind(cm::static_string_view name,
                         Continue (Result::*member)(cm::string_view),
                         ExpectAtLeast expect = { 1 })
  {
    this->Base::Bind(name, [member, expect](Instance& instance) {
      Result* result = static_cast<Result*>(instance.Result);
      instance.Bind(
        [result, member](cm::string_view arg) -> Continue {
          return (result->*member)(arg);
        },
        expect);
    });
    return *this;
  }